

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

Meta * __thiscall spirv_cross::ParsedIR::find_meta(ParsedIR *this,ID id)

{
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_true>
  _Var1;
  key_type local_4;
  
  _Var1._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->meta)._M_h,&local_4);
  if (_Var1._M_cur != (__node_type *)0x0) {
    _Var1._M_cur = (__node_type *)((long)_Var1._M_cur + 0x10);
  }
  return (Meta *)_Var1._M_cur;
}

Assistant:

const Meta *ParsedIR::find_meta(ID id) const
{
	auto itr = meta.find(id);
	if (itr != end(meta))
		return &itr->second;
	else
		return nullptr;
}